

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

int64_t parse_assignment(void)

{
  char *pcVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  void *p;
  size_t internaln_6;
  size_t old_count_6;
  size_t new_size_6;
  size_t old_size_6;
  size_t internaln_5;
  size_t old_count_5;
  size_t new_size_5;
  size_t old_size_5;
  size_t internaln_4;
  size_t old_count_4;
  size_t new_size_4;
  size_t old_size_4;
  size_t internaln_3;
  size_t old_count_3;
  size_t new_size_3;
  size_t old_size_3;
  size_t internaln_2;
  size_t old_count_2;
  size_t new_size_2;
  size_t old_size_2;
  size_t internaln_1;
  size_t old_count_1;
  size_t new_size_1;
  size_t old_size_1;
  size_t internaln;
  size_t old_count;
  size_t new_size;
  size_t old_size;
  int64_t res;
  int32_t ch;
  size_t in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  long local_138;
  int32_t *in_stack_fffffffffffffed0;
  long local_128;
  long local_118;
  long local_110;
  long local_108;
  int local_c;
  int64_t local_8;
  
  iVar2 = next_char();
  if (iVar2 == -1) {
    parse_error("unexpected end-of-file (without \'.\')");
  }
  if (iVar2 == 0x2e) {
    do {
      uVar3 = next_char();
    } while (uVar3 == 0x20);
    if (uVar3 == 0xffffffff) {
      parse_error("end-of-file after \'.\' instead of new-line");
    }
    if (uVar3 != 10) {
      iVar4 = isprint(uVar3);
      if (iVar4 == 0) {
        parse_error("unexpected character code 0x%02x after \'.\'",(ulong)uVar3);
      }
      else {
        parse_error("unexpected character \'%c\' after \'.\'",(ulong)uVar3);
      }
    }
    msg(4,"read terminating \'.\'");
    found_end_of_witness = 1;
    local_8 = -1;
  }
  else if ((iVar2 == 0x40) || (iVar2 == 0x23)) {
    prev_char(iVar2);
    local_8 = -1;
  }
  else {
    prev_char(iVar2);
    local_8 = parse_unsigned_number(in_stack_fffffffffffffed0);
    if (iVar2 != 0x20) {
      parse_error("space missing after \'%ld\'",local_8);
    }
    iVar2 = next_char();
    array_index.top = array_index.start;
    if (iVar2 == 0x5b) {
      index_columno = columno + 1;
      while( true ) {
        local_c = next_char();
        if (local_c != 0x30 && local_c != 0x31) break;
        if (array_index.top == array_index.end) {
          lVar5 = (long)array_index.top - (long)array_index.start;
          if ((long)array_index.end - (long)array_index.start == 0) {
            local_108 = 1;
          }
          else {
            local_108 = ((long)array_index.end - (long)array_index.start) * 2;
          }
          array_index.start =
               (char *)btorsim_realloc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          array_index.top = array_index.start + lVar5;
          array_index.end = array_index.start + local_108;
        }
        pcVar1 = array_index.top + 1;
        *array_index.top = (char)local_c;
        array_index.top = pcVar1;
      }
      if (local_c == 0x2a) {
        if (array_index.top == array_index.end) {
          lVar5 = (long)array_index.top - (long)array_index.start;
          if ((long)array_index.end - (long)array_index.start == 0) {
            local_110 = 1;
          }
          else {
            local_110 = ((long)array_index.end - (long)array_index.start) * 2;
          }
          array_index.start =
               (char *)btorsim_realloc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          array_index.top = array_index.start + lVar5;
          array_index.end = array_index.start + local_110;
        }
        pcVar1 = array_index.top + 1;
        *array_index.top = (char)local_c;
        array_index.top = pcVar1;
        local_c = next_char();
      }
      if (local_c != 0x5d) {
        parse_error("expected ] after index");
      }
      if (array_index.top == array_index.start) {
        parse_error("empty index");
      }
      if (array_index.top == array_index.end) {
        lVar5 = (long)array_index.top - (long)array_index.start;
        if ((long)array_index.end - (long)array_index.start == 0) {
          local_118 = 1;
        }
        else {
          local_118 = ((long)array_index.end - (long)array_index.start) * 2;
        }
        array_index.start =
             (char *)btorsim_realloc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        array_index.top = array_index.start + lVar5;
        array_index.end = array_index.start + local_118;
      }
      pcVar1 = array_index.top + 1;
      *array_index.top = '\0';
      array_index.top = pcVar1;
      iVar2 = next_char();
      if (iVar2 != 0x20) {
        parse_error("space missing after index");
      }
    }
    else {
      prev_char(iVar2);
    }
    constant.top = constant.start;
    constant_columno = columno + 1;
    while (local_c = next_char(), local_c == 0x30 || local_c == 0x31) {
      if (constant.top == constant.end) {
        lVar5 = (long)constant.top - (long)constant.start;
        if ((long)constant.end - (long)constant.start == 0) {
          local_128 = 1;
        }
        else {
          local_128 = ((long)constant.end - (long)constant.start) * 2;
        }
        constant.start =
             (char *)btorsim_realloc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        constant.top = constant.start + lVar5;
        constant.end = constant.start + local_128;
      }
      pcVar1 = constant.top + 1;
      *constant.top = (char)local_c;
      constant.top = pcVar1;
    }
    if (constant.top == constant.start) {
      parse_error("empty constant");
    }
    else if ((local_c != 0x20) && (local_c != 10)) {
      parse_error("expected space or new-line after assignment");
    }
    if (constant.top == constant.end) {
      lVar5 = (long)constant.top - (long)constant.start;
      if ((long)constant.end - (long)constant.start == 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = ((long)constant.end - (long)constant.start) * 2;
      }
      constant.start = (char *)btorsim_realloc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      constant.top = constant.start + lVar5;
      constant.end = constant.start + lVar6;
    }
    pcVar1 = constant.top + 1;
    *constant.top = '\0';
    constant.top = pcVar1;
    symbol.top = symbol.start;
    while (local_c != 10) {
      local_c = next_char();
      if (local_c == -1) {
        parse_error("unexpected end-of-file in assignment");
      }
      else if (local_c != 10) {
        if (symbol.top == symbol.end) {
          lVar5 = (long)symbol.top - (long)symbol.start;
          if ((long)symbol.end - (long)symbol.start == 0) {
            local_138 = 1;
          }
          else {
            local_138 = ((long)symbol.end - (long)symbol.start) * 2;
          }
          symbol.start = (char *)btorsim_realloc(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                                                );
          symbol.top = symbol.start + lVar5;
          symbol.end = symbol.start + local_138;
        }
        pcVar1 = symbol.top + 1;
        *symbol.top = (char)local_c;
        symbol.top = pcVar1;
      }
    }
    if (symbol.top != symbol.start) {
      if (symbol.top == symbol.end) {
        lVar5 = (long)symbol.top - (long)symbol.start;
        if ((long)symbol.end - (long)symbol.start == 0) {
          p = (void *)0x1;
        }
        else {
          p = (void *)(((long)symbol.end - (long)symbol.start) * 2);
        }
        symbol.start = (char *)btorsim_realloc(p,in_stack_fffffffffffffeb8);
        symbol.top = symbol.start + lVar5;
        symbol.end = symbol.start + (long)p;
      }
      pcVar1 = symbol.top + 1;
      *symbol.top = '\0';
      symbol.top = pcVar1;
    }
  }
  return local_8;
}

Assistant:

static int64_t
parse_assignment ()
{
  int32_t ch = next_char ();
  if (ch == EOF) parse_error ("unexpected end-of-file (without '.')");
  if (ch == '.')
  {
    while ((ch = next_char ()) == ' ')
      ;
    if (ch == EOF) parse_error ("end-of-file after '.' instead of new-line");
    if (ch != '\n')
    {
      if (isprint (ch))
        parse_error ("unexpected character '%c' after '.'", ch);
      else
        parse_error ("unexpected character code 0x%02x after '.'", ch);
    }
    msg (4, "read terminating '.'");
    found_end_of_witness = 1;
    return -1;
  }
  if (ch == '@' || ch == '#')
  {
    prev_char (ch);
    return -1;
  }
  prev_char (ch);
  int64_t res = parse_unsigned_number (&ch);
  if (ch != ' ') parse_error ("space missing after '%" PRId64 "'", res);
  ch = next_char ();
  BTOR2_RESET_STACK (array_index);
  if (ch == '[')
  {
    index_columno = columno + 1;
    while ((ch = next_char ()) == '0' || ch == '1')
      BTOR2_PUSH_STACK (array_index, ch);
    /* btormc trace compatibility: btormc --trace-gen-full represents
     * 'initialize all array elements' as <id> [*] <value> */
    if (ch == '*')
    {
      BTOR2_PUSH_STACK (array_index, ch);
      ch = next_char ();
    }
    if (ch != ']') parse_error ("expected ] after index");
    if (BTOR2_EMPTY_STACK (array_index)) parse_error ("empty index");
    BTOR2_PUSH_STACK (array_index, 0);
    ch = next_char ();
    if (ch != ' ') parse_error ("space missing after index");
  }
  else
  {
    prev_char (ch);
  }
  BTOR2_RESET_STACK (constant);
  constant_columno = columno + 1;
  while ((ch = next_char ()) == '0' || ch == '1')
    BTOR2_PUSH_STACK (constant, ch);
  if (BTOR2_EMPTY_STACK (constant))
    parse_error ("empty constant");
  else if (ch != ' ' && ch != '\n')
    parse_error ("expected space or new-line after assignment");
  BTOR2_PUSH_STACK (constant, 0);
  BTOR2_RESET_STACK (symbol);
  while (ch != '\n')
    if ((ch = next_char ()) == EOF)
      parse_error ("unexpected end-of-file in assignment");
    else if (ch != '\n')
      BTOR2_PUSH_STACK (symbol, ch);
  if (!BTOR2_EMPTY_STACK (symbol)) BTOR2_PUSH_STACK (symbol, 0);
  return res;
}